

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::SetVersionInfo
          (RowGroup *this,shared_ptr<duckdb::RowVersionManager,_true> *version)

{
  shared_ptr<duckdb::RowVersionManager,_true>::operator=(&this->owned_version_info,version);
  LOCK();
  (this->version_info)._M_i.ptr =
       (this->owned_version_info).internal.
       super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  UNLOCK();
  return;
}

Assistant:

void RowGroup::SetVersionInfo(shared_ptr<RowVersionManager> version) {
	owned_version_info = std::move(version);
	version_info = owned_version_info.get();
}